

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O2

TestDriver * __thiscall xs::ExecutionServer::acquireTestDriver(ExecutionServer *this)

{
  bool bVar1;
  Error *this_00;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = de::Mutex::tryLock(&this->m_testDriverLock);
  if (bVar1) {
    return &this->m_testDriver;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Failed to acquire test driver",&local_39);
  Error::Error(this_00,&local_38);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TestDriver* ExecutionServer::acquireTestDriver (void)
{
	if (!m_testDriverLock.tryLock())
		throw Error("Failed to acquire test driver");

	return &m_testDriver;
}